

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintAuto(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_40;
  uint local_3c;
  int fVerbose;
  int fNaive;
  int Output;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fVerbose = -1;
  local_3c = 0;
  local_40 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"Onvh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pNtk_00);
      if (iVar1 == 0) {
        Abc_Print(-1,"This command works only for AIGs (run \"strash\").\n");
        return 1;
      }
      Abc_NtkAutoPrint(pNtk_00,fVerbose,local_3c,local_40);
      return 0;
    }
    switch(iVar1) {
    case 0x4f:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-O\" should be followed by an integer.\n");
        goto LAB_00227426;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fVerbose < 0) {
LAB_00227426:
        Abc_Print(-2,"usage: print_auto [-O <num>] [-nvh]\n");
        Abc_Print(-2,"\t           computes autosymmetries of the PO functions\n");
        Abc_Print(-2,"\t-O <num> : (optional) the 0-based number of the output [default = all]\n");
        pcVar2 = "no";
        if (local_3c != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-n       : enable naive BDD-based computation [default = %s].\n",pcVar2);
        pcVar2 = "no";
        if (local_40 != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-v       : enable verbose output [default = %s].\n",pcVar2);
        Abc_Print(-2,"\t-h       : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_00227426;
    case 0x68:
      goto LAB_00227426;
    case 0x6e:
      local_3c = local_3c ^ 1;
      break;
    case 0x76:
      local_40 = local_40 ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandPrintAuto( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int Output;
    int fNaive;
    int fVerbose;
    extern void Abc_NtkAutoPrint( Abc_Ntk_t * pNtk, int Output, int fNaive, int fVerbose );

    // set defaults
    Output   = -1;
    fNaive   = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Onvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            Output = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Output < 0 )
                goto usage;
            break;
        case 'n':
            fNaive ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for AIGs (run \"strash\").\n" );
        return 1;
    }


    Abc_NtkAutoPrint( pNtk, Output, fNaive, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: print_auto [-O <num>] [-nvh]\n" );
    Abc_Print( -2, "\t           computes autosymmetries of the PO functions\n" );
    Abc_Print( -2, "\t-O <num> : (optional) the 0-based number of the output [default = all]\n");
    Abc_Print( -2, "\t-n       : enable naive BDD-based computation [default = %s].\n", fNaive? "yes": "no" );
    Abc_Print( -2, "\t-v       : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}